

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Learn.cpp
# Opt level: O0

int __thiscall Qclass::detAction(Qclass *this,int state)

{
  int iVar1;
  int local_34;
  double dStack_30;
  int i;
  double maxQ;
  int randAction;
  int temp;
  int chosenAction;
  int action;
  int state_local;
  Qclass *this_local;
  
  iVar1 = rand();
  if (iVar1 % 100 < 0x51) {
    dStack_30 = -10000.0;
    for (local_34 = 0; local_34 < 4; local_34 = local_34 + 1) {
      if (dStack_30 <= this->Q[state][local_34]) {
        dStack_30 = this->Q[state][local_34];
        randAction = local_34;
      }
    }
  }
  else {
    iVar1 = rand();
    randAction = iVar1 % 4;
  }
  return randAction;
}

Assistant:

int Qclass::detAction(int state) {
  int action;
  int chosenAction;
  int temp = rand() % 100;
  if (temp > 80) {   // Randomly explores for an action 20% of the time
    int randAction = rand() % 4;
    chosenAction = randAction;
  } else {
    double maxQ = -10000;
    for (int i = 0; i < 4; i++) {
      if (Q[state][i] >= maxQ) {
        maxQ = Q[state][i];
        chosenAction = i;
      }
    }
  }
  action = chosenAction;
  return action;
}